

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O1

void anon_unknown.dwarf_1e45e::reduceY
               (ChannelList *channels,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *doNotFilter,Extrapolation ext,bool odd,Image *image0,Image *image1)

{
  _Rb_tree_color _Var1;
  Image *pIVar2;
  Image *pIVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  char cVar7;
  ushort uVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  const_iterator cVar11;
  TypedImageChannel<float> *channel;
  TypedImageChannel<float> *pTVar12;
  TypedImageChannel<Imath_3_2::half> *channel_00;
  TypedImageChannel<Imath_3_2::half> *pTVar13;
  half *phVar14;
  TypedImageChannel<unsigned_int> *channel_01;
  TypedImageChannel<unsigned_int> *pTVar15;
  int iVar16;
  uint uVar17;
  undefined7 in_register_00000009;
  float fVar18;
  long lVar19;
  float *pfVar20;
  half *phVar21;
  uint *puVar22;
  uint *puVar23;
  float *pfVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  float fVar30;
  allocator<char> local_f6;
  allocator<char> local_f5;
  uint local_f4;
  double local_f0;
  ulong local_e8;
  double local_e0;
  undefined4 local_d4;
  key_type local_d0;
  _Rb_tree_node_base *local_b0;
  ulong local_a8;
  long local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  string local_78;
  _Base_ptr local_58;
  Image *local_50;
  Image *local_48;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  ChannelList *local_38;
  
  local_d4 = (undefined4)CONCAT71(in_register_00000009,odd);
  local_50 = image1;
  local_48 = image0;
  local_40 = &doNotFilter->_M_t;
  p_Var9 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  local_38 = channels;
  p_Var10 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
  if (p_Var9 != p_Var10) {
    local_58 = &(((_Rep_type *)&local_40->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
    do {
      p_Var10 = p_Var9 + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,(char *)p_Var10,(allocator<char> *)&local_78);
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(local_40,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      _Var1 = p_Var9[9]._M_color;
      if (_Var1 == _S_red) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,(char *)p_Var10,&local_f5);
        channel_01 = Image::typedChannel<unsigned_int>(local_48,&local_d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,(char *)p_Var10,&local_f6);
        pTVar15 = Image::typedChannel<unsigned_int>(local_50,&local_78);
        pIVar2 = (pTVar15->super_ImageChannel)._image;
        local_f4 = ((pIVar2->_dataWindow).max.x - (pIVar2->_dataWindow).min.x) + 1;
        pIVar3 = (channel_01->super_ImageChannel)._image;
        iVar28 = (pIVar3->_dataWindow).max.y - (pIVar3->_dataWindow).min.y;
        iVar29 = iVar28 + 1;
        iVar16 = (pIVar2->_dataWindow).max.y - (pIVar2->_dataWindow).min.y;
        uVar17 = iVar16 + 1;
        if (cVar11._M_node == local_58) {
          local_e0 = 1.0;
          if (1 < (int)uVar17) {
            local_e0 = (double)(iVar28 + -1) / (double)iVar16;
          }
          local_b0 = p_Var9;
          if (0 < (int)uVar17) {
            puVar23 = (pTVar15->_pixels)._data;
            local_a8 = (ulong)uVar17;
            uVar25 = (ulong)local_f4;
            local_a0 = (pTVar15->_pixels)._sizeY << 2;
            local_e8 = 0;
            do {
              if (0 < (int)local_f4) {
                local_80 = (double)(int)local_e8 * local_e0;
                local_88 = local_80 + -1.0;
                local_90 = local_80 + 1.0;
                local_98 = local_80 + 2.0;
                uVar26 = 0;
                do {
                  iVar16 = (int)uVar26;
                  local_f0 = sampleY<unsigned_int>(channel_01,iVar29,iVar16,local_88,ext);
                  dVar6 = sampleY<unsigned_int>(channel_01,iVar29,iVar16,local_80,ext);
                  local_f0 = local_f0 * 0.125 + dVar6 * 0.375;
                  dVar6 = sampleY<unsigned_int>(channel_01,iVar29,iVar16,local_90,ext);
                  local_f0 = dVar6 * 0.375 + local_f0;
                  dVar6 = sampleY<unsigned_int>(channel_01,iVar29,iVar16,local_98,ext);
                  puVar23[uVar26] = (uint)(long)(dVar6 * 0.125 + local_f0);
                  uVar26 = uVar26 + 1;
                } while (uVar25 != uVar26);
              }
              local_e8 = local_e8 + 1;
              puVar23 = (uint *)((long)puVar23 + local_a0);
            } while (local_e8 != local_a8);
          }
        }
        else {
          local_b0 = p_Var9;
          if (0 < (int)uVar17) {
            lVar19 = (long)(int)(iVar29 + uVar17 * -2 + 1);
            lVar4 = (channel_01->_pixels)._sizeY;
            lVar5 = (pTVar15->_pixels)._sizeY;
            puVar23 = (pTVar15->_pixels)._data;
            if ((char)local_d4 == '\0') {
              lVar19 = 0;
            }
            puVar22 = (channel_01->_pixels)._data + lVar19 * lVar4;
            uVar25 = 0;
            do {
              if (0 < (int)local_f4) {
                uVar26 = 0;
                do {
                  puVar23[uVar26] = puVar22[uVar26];
                  uVar26 = uVar26 + 1;
                } while (local_f4 != uVar26);
              }
              uVar25 = uVar25 + 1;
              puVar23 = puVar23 + lVar5;
              puVar22 = puVar22 + lVar4 * 2;
            } while (uVar25 != uVar17);
          }
        }
LAB_00108f97:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        p_Var9 = local_b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if (_Var1 == _S_black) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,(char *)p_Var10,&local_f5);
          channel_00 = Image::typedChannel<Imath_3_2::half>(local_48,&local_d0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,(char *)p_Var10,&local_f6);
          local_b0 = p_Var9;
          pTVar13 = Image::typedChannel<Imath_3_2::half>(local_50,&local_78);
          pIVar2 = (pTVar13->super_ImageChannel)._image;
          local_f4 = ((pIVar2->_dataWindow).max.x - (pIVar2->_dataWindow).min.x) + 1;
          pIVar3 = (channel_00->super_ImageChannel)._image;
          iVar28 = (pIVar3->_dataWindow).max.y - (pIVar3->_dataWindow).min.y;
          iVar29 = iVar28 + 1;
          iVar16 = (pIVar2->_dataWindow).max.y - (pIVar2->_dataWindow).min.y;
          uVar17 = iVar16 + 1;
          if (cVar11._M_node == local_58) {
            local_e0 = 1.0;
            if (1 < (int)uVar17) {
              local_e0 = (double)(iVar28 + -1) / (double)iVar16;
            }
            if (0 < (int)uVar17) {
              phVar14 = (pTVar13->_pixels)._data;
              local_a8 = (ulong)uVar17;
              uVar25 = (ulong)local_f4;
              local_a0 = (pTVar13->_pixels)._sizeY * 2;
              local_e8 = 0;
              do {
                if (0 < (int)local_f4) {
                  local_80 = (double)(int)local_e8 * local_e0;
                  local_88 = local_80 + -1.0;
                  local_90 = local_80 + 1.0;
                  local_98 = local_80 + 2.0;
                  uVar26 = 0;
                  do {
                    iVar16 = (int)uVar26;
                    local_f0 = sampleY<Imath_3_2::half>(channel_00,iVar29,iVar16,local_88,ext);
                    dVar6 = sampleY<Imath_3_2::half>(channel_00,iVar29,iVar16,local_80,ext);
                    local_f0 = local_f0 * 0.125 + dVar6 * 0.375;
                    dVar6 = sampleY<Imath_3_2::half>(channel_00,iVar29,iVar16,local_90,ext);
                    local_f0 = dVar6 * 0.375 + local_f0;
                    dVar6 = sampleY<Imath_3_2::half>(channel_00,iVar29,iVar16,local_98,ext);
                    fVar30 = (float)(dVar6 * 0.125 + local_f0);
                    fVar18 = ABS(fVar30);
                    uVar8 = (ushort)((uint)fVar30 >> 0x10) & 0x8000;
                    if ((uint)fVar18 < 0x38800000) {
                      if ((0x33000000 < (uint)fVar18) &&
                         (uVar17 = (uint)fVar18 & 0x7fffff | 0x800000,
                         cVar7 = (char)((uint)fVar18 >> 0x17),
                         uVar8 = uVar8 | (ushort)(uVar17 >> (0x7eU - cVar7 & 0x1f)),
                         0x80000000 < uVar17 << (cVar7 + 0xa2U & 0x1f))) {
                        uVar8 = uVar8 + 1;
                      }
                    }
                    else if ((uint)fVar18 < 0x7f800000) {
                      if ((uint)fVar18 < 0x477ff000) {
                        uVar8 = (ushort)((int)fVar18 + 0x8000fff +
                                         (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd) | uVar8;
                      }
                      else {
                        uVar8 = uVar8 | 0x7c00;
                      }
                    }
                    else {
                      uVar8 = uVar8 | 0x7c00;
                      if (fVar18 != INFINITY) {
                        uVar17 = (uint)fVar18 >> 0xd & 0x3ff;
                        uVar8 = uVar8 | (ushort)uVar17 | (ushort)(uVar17 == 0);
                      }
                    }
                    phVar14[uVar26]._h = uVar8;
                    uVar26 = uVar26 + 1;
                  } while (uVar25 != uVar26);
                }
                local_e8 = local_e8 + 1;
                phVar14 = (half *)((long)&phVar14->_h + local_a0);
              } while (local_e8 != local_a8);
            }
          }
          else if (0 < (int)uVar17) {
            lVar19 = (long)(int)(iVar29 + uVar17 * -2 + 1);
            lVar4 = (channel_00->_pixels)._sizeY;
            lVar5 = (pTVar13->_pixels)._sizeY;
            phVar14 = (pTVar13->_pixels)._data;
            if ((char)local_d4 == '\0') {
              lVar19 = 0;
            }
            phVar21 = (channel_00->_pixels)._data + lVar19 * lVar4;
            uVar25 = 0;
            do {
              if (0 < (int)local_f4) {
                uVar26 = 0;
                do {
                  phVar14[uVar26]._h = phVar21[uVar26]._h;
                  uVar26 = uVar26 + 1;
                } while (local_f4 != uVar26);
              }
              uVar25 = uVar25 + 1;
              phVar14 = phVar14 + lVar5;
              phVar21 = phVar21 + lVar4 * 2;
            } while (uVar25 != uVar17);
          }
          goto LAB_00108f97;
        }
        if (_Var1 == 2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,(char *)p_Var10,&local_f5);
          channel = Image::typedChannel<float>(local_48,&local_d0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,(char *)p_Var10,&local_f6);
          pTVar12 = Image::typedChannel<float>(local_50,&local_78);
          pIVar2 = (pTVar12->super_ImageChannel)._image;
          uVar27 = ((pIVar2->_dataWindow).max.x - (pIVar2->_dataWindow).min.x) + 1;
          pIVar3 = (channel->super_ImageChannel)._image;
          iVar28 = (pIVar3->_dataWindow).max.y - (pIVar3->_dataWindow).min.y;
          iVar29 = iVar28 + 1;
          iVar16 = (pIVar2->_dataWindow).max.y - (pIVar2->_dataWindow).min.y;
          uVar17 = iVar16 + 1;
          if (cVar11._M_node == local_58) {
            local_e0 = 1.0;
            if (1 < (int)uVar17) {
              local_e0 = (double)(iVar28 + -1) / (double)iVar16;
            }
            local_b0 = p_Var9;
            if (0 < (int)uVar17) {
              pfVar24 = (pTVar12->_pixels)._data;
              local_a8 = (ulong)uVar17;
              local_a0 = (pTVar12->_pixels)._sizeY << 2;
              local_e8 = 0;
              local_f4 = uVar27;
              do {
                if (0 < (int)local_f4) {
                  local_80 = (double)(int)local_e8 * local_e0;
                  local_88 = local_80 + -1.0;
                  local_90 = local_80 + 1.0;
                  local_98 = local_80 + 2.0;
                  uVar25 = 0;
                  do {
                    iVar16 = (int)uVar25;
                    local_f0 = sampleY<float>(channel,iVar29,iVar16,local_88,ext);
                    dVar6 = sampleY<float>(channel,iVar29,iVar16,local_80,ext);
                    local_f0 = local_f0 * 0.125 + dVar6 * 0.375;
                    dVar6 = sampleY<float>(channel,iVar29,iVar16,local_90,ext);
                    local_f0 = dVar6 * 0.375 + local_f0;
                    dVar6 = sampleY<float>(channel,iVar29,iVar16,local_98,ext);
                    pfVar24[uVar25] = (float)(dVar6 * 0.125 + local_f0);
                    uVar25 = uVar25 + 1;
                  } while (uVar27 != uVar25);
                }
                local_e8 = local_e8 + 1;
                pfVar24 = (float *)((long)pfVar24 + local_a0);
              } while (local_e8 != local_a8);
            }
          }
          else {
            local_b0 = p_Var9;
            if (0 < (int)uVar17) {
              lVar19 = (long)(int)(iVar29 + uVar17 * -2 + 1);
              lVar4 = (channel->_pixels)._sizeY;
              lVar5 = (pTVar12->_pixels)._sizeY;
              pfVar24 = (pTVar12->_pixels)._data;
              if ((char)local_d4 == '\0') {
                lVar19 = 0;
              }
              pfVar20 = (channel->_pixels)._data + lVar19 * lVar4;
              uVar25 = 0;
              do {
                if (0 < (int)uVar27) {
                  uVar26 = 0;
                  do {
                    pfVar24[uVar26] = pfVar20[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar27 != uVar26);
                }
                uVar25 = uVar25 + 1;
                pfVar24 = pfVar24 + lVar5;
                pfVar20 = pfVar20 + lVar4 * 2;
              } while (uVar25 != uVar17);
            }
          }
          goto LAB_00108f97;
        }
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      p_Var10 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    } while (p_Var9 != p_Var10);
  }
  return;
}

Assistant:

void
reduceY (
    const ChannelList& channels,
    const set<string>& doNotFilter,
    Extrapolation      ext,
    bool               odd,
    const Image&       image0,
    Image&             image1)
{
    //
    // Shrink image image0 vertically by a factor of 2,
    // and store the result in image image1.
    //

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        const char*    name    = i.name ();
        const Channel& channel = i.channel ();
        bool           filter = (doNotFilter.find (name) == doNotFilter.end ());

        switch (channel.type)
        {
            case IMF::HALF:

                reduceY (
                    image0.typedChannel<half> (name),
                    image1.typedChannel<half> (name),
                    filter,
                    ext,
                    odd);
                break;

            case IMF::FLOAT:

                reduceY (
                    image0.typedChannel<float> (name),
                    image1.typedChannel<float> (name),
                    filter,
                    ext,
                    odd);
                break;

            case IMF::UINT:

                reduceY (
                    image0.typedChannel<unsigned int> (name),
                    image1.typedChannel<unsigned int> (name),
                    filter,
                    ext,
                    odd);
                break;
            default: break;
        }
    }
}